

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessState
          (Value *__return_storage_ptr__,Interpreter *this,Expression *param_1)

{
  ErrorCode EVar1;
  uint uVar2;
  Value *pVVar3;
  string *this_00;
  CommissionerAppPtr commissioner;
  allocator local_119;
  CommissionerAppPtr local_118;
  Value local_108;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  undefined1 local_40 [40];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_118.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_118.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  JobManager::GetSelectedCommissioner
            ((Error *)local_40,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_118);
  Value::Value(&local_108,(Error *)local_40);
  pVVar3 = Value::operator=(__return_storage_ptr__,&local_108);
  EVar1 = (pVVar3->mError).mCode;
  Value::~Value(&local_108);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  if (EVar1 == kNone) {
    uVar2 = (*((local_118.
                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0xb])();
    switch(uVar2 & 0xff) {
    case 0:
      std::__cxx11::string::string((string *)&local_60,"disabled",&local_119);
      Value::Value(&local_108,&local_60);
      Value::operator=(__return_storage_ptr__,&local_108);
      Value::~Value(&local_108);
      this_00 = &local_60;
      break;
    case 1:
      std::__cxx11::string::string((string *)&local_80,"connected",&local_119);
      Value::Value(&local_108,&local_80);
      Value::operator=(__return_storage_ptr__,&local_108);
      Value::~Value(&local_108);
      this_00 = &local_80;
      break;
    case 2:
      std::__cxx11::string::string((string *)&local_a0,"petitioning",&local_119);
      Value::Value(&local_108,&local_a0);
      Value::operator=(__return_storage_ptr__,&local_108);
      Value::~Value(&local_108);
      this_00 = &local_a0;
      break;
    case 3:
      std::__cxx11::string::string((string *)&local_c0,"active",&local_119);
      Value::Value(&local_108,&local_c0);
      Value::operator=(__return_storage_ptr__,&local_108);
      Value::~Value(&local_108);
      this_00 = &local_c0;
      break;
    default:
      goto switchD_001fabfe_default;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
switchD_001fabfe_default:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessState(const Expression &)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));

    switch (commissioner->GetState())
    {
    case State::kDisabled:
        value = std::string("disabled");
        break;
    case State::kConnected:
        value = std::string("connected");
        break;
    case State::kPetitioning:
        value = std::string("petitioning");
        break;
    case State::kActive:
        value = std::string("active");
        break;
    }

exit:
    return value;
}